

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

uint32_t __thiscall B000FFReadWriter::calcbytesum(B000FFReadWriter *this,size_t size)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  unsigned_long *puVar4;
  element_type *peVar5;
  reference pvVar6;
  undefined4 extraout_var;
  size_t nr;
  uint local_50;
  uint32_t want;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  ByteVector buf;
  size_t sStack_18;
  uint32_t sum;
  size_t size_local;
  B000FFReadWriter *this_local;
  size_t size_00;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uVar1 = this->_blocksize;
  sStack_18 = size;
  size_local = (size_t)this;
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,(ulong)uVar1,
             &local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  for (; sStack_18 != 0; sStack_18 = sStack_18 - size_00) {
    nr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    puVar4 = std::min<unsigned_long>(&nr,&stack0xffffffffffffffe8);
    local_50 = (uint)*puVar4;
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    iVar2 = (*peVar5->_vptr_ReadWriter[2])(peVar5,pvVar6,(ulong)local_50);
    size_00 = CONCAT44(extraout_var,iVar2);
    if (size_00 == 0) break;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    uVar3 = calcbuffersum(this,pvVar6,size_00);
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         uVar3 + buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  uVar3 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return uVar3;
}

Assistant:

uint32_t calcbytesum(size_t size)
    {
        uint32_t sum= 0;
        ByteVector buf(_blocksize);
        while (size)
        {
            uint32_t want= std::min(buf.size(), size);
            size_t nr= _r->read(&buf[0], want);
            if (nr==0)
                break;
            
            sum += calcbuffersum(&buf[0], nr);
            size -= nr;
        }

        return sum;
    }